

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_app.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  Option *pOVar2;
  element_type *this;
  ostream *poVar3;
  size_t sVar4;
  allocator local_631;
  string local_630;
  allocator local_609;
  string local_608;
  string local_5e8;
  allocator local_5c1;
  string local_5c0;
  undefined4 local_59c;
  ParseError *e;
  allocator local_579;
  string local_578;
  allocator local_551;
  string local_550;
  _Manager_type local_530;
  double value;
  string local_520;
  allocator local_4f9;
  string local_4f8;
  Option *local_4d8;
  Option *flag;
  int v;
  allocator local_4a1;
  string local_4a0;
  undefined1 local_480 [8];
  Option *copt;
  int count;
  allocator local_449;
  string local_448;
  Option *local_428;
  Option *opt;
  string file;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  allocator local_399;
  string local_398;
  undefined1 local_378 [8];
  App app;
  char **argv_local;
  int argc_local;
  
  app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"configuration print example",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d0,"",&local_3d1);
  CLI::App::App((App *)local_378,&local_398,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3f8,"-p,--print",(allocator *)(file.field_2._M_local_buf + 0xf));
  pOVar2 = CLI::App::add_flag<const_char[29],_(CLI::detail::enabler)0>
                     ((App *)local_378,&local_3f8,(char (*) [29])"Print configuration and exit");
  CLI::OptionBase<CLI::Option>::configurable(&pOVar2->super_OptionBase<CLI::Option>,false);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)(file.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&opt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_448,"-f,--file,file",&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&count,"File name",(allocator *)((long)&copt + 7));
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     ((App *)local_378,&local_448,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt,
                      (string *)&count);
  pOVar2 = CLI::Option::capture_default_str(pOVar2);
  pOVar2 = CLI::Option::run_callback_for_default(pOVar2,true);
  std::__cxx11::string::~string((string *)&count);
  std::allocator<char>::~allocator((allocator<char> *)((long)&copt + 7));
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  copt._0_4_ = 0;
  local_428 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a0,"-c,--count",&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&v,"Counter",(allocator *)((long)&flag + 7));
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     ((App *)local_378,&local_4a0,(int *)&copt,(string *)&v);
  pOVar2 = CLI::Option::capture_default_str(pOVar2);
  std::__cxx11::string::~string((string *)&v);
  std::allocator<char>::~allocator((allocator<char> *)((long)&flag + 7));
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  flag._0_4_ = 0;
  local_480 = (undefined1  [8])pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f8,"--flag",&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_520,"Some flag that can be passed multiple times",
             (allocator *)((long)&value + 7));
  pOVar2 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>
                     ((App *)local_378,&local_4f8,(int *)&flag,&local_520);
  pOVar2 = CLI::Option::capture_default_str(pOVar2);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  local_530 = (_Manager_type)0x0;
  local_4d8 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_550,"-d,--double",&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_578,"Some Value",&local_579);
  pOVar2 = CLI::App::add_option<double,_double,_(CLI::detail::enabler)0>
                     ((App *)local_378,&local_550,(double *)&local_530,&local_578);
  CLI::Option::capture_default_str(pOVar2);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  CLI::App::get_config_formatter_base((App *)&e);
  this = CLI::std::__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)&e);
  CLI::ConfigBase::quoteCharacter(this,'\"','\"');
  CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)&e);
  CLI::App::parse((App *)local_378,argc,
                  (char **)app.config_formatter_.
                           super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c0,"--print",&local_5c1);
  pOVar2 = CLI::App::get_option((App *)local_378,&local_5c0);
  bVar1 = CLI::Option::as<bool>(pOVar2);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  if (bVar1) {
    CLI::App::config_to_str_abi_cxx11_(&local_5e8,(App *)local_378,true,false);
    std::operator<<((ostream *)&std::cout,(string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_5e8);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Working on file: ");
    poVar3 = std::operator<<(poVar3,(string *)&opt);
    poVar3 = std::operator<<(poVar3,", direct count: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_608,"--file",&local_609);
    sVar4 = CLI::App::count((App *)local_378,&local_608);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    poVar3 = std::operator<<(poVar3,", opt count: ");
    sVar4 = CLI::Option::count(local_428);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator((allocator<char> *)&local_609);
    poVar3 = std::operator<<((ostream *)&std::cout,"Working on count: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)copt);
    poVar3 = std::operator<<(poVar3,", direct count: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_630,"--count",&local_631);
    sVar4 = CLI::App::count((App *)local_378,&local_630);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    poVar3 = std::operator<<(poVar3,", opt count: ");
    sVar4 = CLI::Option::count((Option *)local_480);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator((allocator<char> *)&local_631);
    poVar3 = std::operator<<((ostream *)&std::cout,"Received flag: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)flag);
    poVar3 = std::operator<<(poVar3," (");
    sVar4 = CLI::Option::count(local_4d8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    std::operator<<(poVar3,") times\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"Some value: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)local_530);
    std::operator<<(poVar3,'\n');
  }
  local_59c = 1;
  std::__cxx11::string::~string((string *)&opt);
  CLI::App::~App((App *)local_378);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("configuration print example");

    app.add_flag("-p,--print", "Print configuration and exit")->configurable(false);  // NEW: print flag

    std::string file;
    CLI::Option *opt = app.add_option("-f,--file,file", file, "File name")
                           ->capture_default_str()
                           ->run_callback_for_default();  // NEW: capture_default_str()

    int count{0};
    CLI::Option *copt =
        app.add_option("-c,--count", count, "Counter")->capture_default_str();  // NEW: capture_default_str()

    int v{0};
    CLI::Option *flag = app.add_flag("--flag", v, "Some flag that can be passed multiple times")
                            ->capture_default_str();  // NEW: capture_default_str()

    double value{0.0};                                                          // = 3.14;
    app.add_option("-d,--double", value, "Some Value")->capture_default_str();  // NEW: capture_default_str()

    app.get_config_formatter_base()->quoteCharacter('"', '"');

    CLI11_PARSE(app, argc, argv);

    if(app.get_option("--print")->as<bool>()) {  // NEW: print configuration and exit
        std::cout << app.config_to_str(true, false);
        return 0;
    }

    std::cout << "Working on file: " << file << ", direct count: " << app.count("--file")
              << ", opt count: " << opt->count() << '\n';
    std::cout << "Working on count: " << count << ", direct count: " << app.count("--count")
              << ", opt count: " << copt->count() << '\n';
    std::cout << "Received flag: " << v << " (" << flag->count() << ") times\n";
    std::cout << "Some value: " << value << '\n';

    return 0;
}